

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  int iVar1;
  ulong size;
  StringPtr *pSVar2;
  NullableValue<kj::Exception> *other;
  Exception *pEVar3;
  int *piVar4;
  Exception *params_1;
  size_t extraout_RDX;
  ArrayPtr<kj::StringPtr> AVar5;
  ArrayDisposer **local_428;
  CleanShutdownException *e;
  StringPtr local_400;
  MainFunc *local_3f0;
  Fault *local_3e8;
  undefined1 *local_3e0;
  Maybe<kj::Exception> local_3d8;
  undefined1 local_278 [8];
  NullableValue<kj::Exception> exception;
  StringPtr *local_110;
  int local_104;
  undefined1 auStack_100 [4];
  int i;
  ArrayPtr<kj::StringPtr> params;
  Array<kj::StringPtr> params_heap;
  StringPtr params_stack [8];
  bool params_isOnStack;
  size_t params_size;
  undefined8 local_38;
  Fault local_30;
  Fault f;
  char **argv_local;
  int argc_local;
  MainFunc *func_local;
  ProcessContext *context_local;
  
  f.exception = (Exception *)argv;
  setStandardIoMode(0);
  setStandardIoMode(1);
  setStandardIoMode(2);
  if (argc < 1) {
    _::Debug::Fault::Fault
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0xdd,FAILED,"argc > 0","");
    _::Debug::Fault::fatal(&local_30);
  }
  size = (ulong)(argc + -1);
  local_428 = &params_heap.disposer;
  do {
    StringPtr::StringPtr((StringPtr *)local_428);
    local_428 = local_428 + 2;
  } while (local_428 != (ArrayDisposer **)&params_stack[7].content.size_);
  if (size < 9) {
    Array<kj::StringPtr>::Array((Array<kj::StringPtr> *)&params.size_,(void *)0x0);
    AVar5 = arrayPtr<kj::StringPtr>((StringPtr *)&params_heap.disposer,size);
    _auStack_100 = AVar5.ptr;
  }
  else {
    heapArray<kj::StringPtr>((Array<kj::StringPtr> *)&params.size_,size);
    AVar5 = Array::operator_cast_to_ArrayPtr((Array *)&params.size_);
    _auStack_100 = AVar5.ptr;
  }
  params.ptr = (StringPtr *)AVar5.size_;
  local_104 = 1;
  while( true ) {
    params_1 = (Exception *)AVar5.ptr;
    if (argc <= local_104) break;
    StringPtr::StringPtr
              ((StringPtr *)((long)&exception.field_1 + 0x150),
               (char *)(f.exception)->trace[(long)local_104 + -10]);
    pSVar2 = ArrayPtr<kj::StringPtr>::operator[]
                       ((ArrayPtr<kj::StringPtr> *)auStack_100,(long)(local_104 + -1));
    AVar5.size_ = extraout_RDX;
    AVar5.ptr = local_110;
    (pSVar2->content).ptr = (char *)exception.field_1._336_8_;
    (pSVar2->content).size_ = (size_t)local_110;
    local_104 = local_104 + 1;
  }
  local_3e8 = &f;
  local_3e0 = auStack_100;
  local_3f0 = func;
  runCatchingExceptions<kj::runMainAndExit(kj::ProcessContext&,kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>&&,int,char**)::__0>
            (&local_3d8,(kj *)&local_3f0,(Type *)AVar5.size_);
  other = _::readMaybe<kj::Exception>(&local_3d8);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_278,other);
  Maybe<kj::Exception>::~Maybe(&local_3d8);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_278);
  if (pEVar3 != (Exception *)0x0) {
    pEVar3 = _::NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_278);
    str<char_const(&)[28],kj::Exception&>
              ((String *)&e,(kj *)"*** Uncaught exception ***\n",(char (*) [28])pEVar3,params_1);
    StringPtr::StringPtr(&local_400,(String *)&e);
    (*context->_vptr_ProcessContext[3])(context,local_400.content.ptr,local_400.content.size_);
    String::~String((String *)&e);
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_278);
  (*context->_vptr_ProcessContext[1])();
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_278);
  Array<kj::StringPtr>::~Array((Array<kj::StringPtr> *)&params.size_);
  if (params_size._4_4_ != 1) {
    _Unwind_Resume(local_38);
  }
  piVar4 = (int *)__cxa_begin_catch(local_38);
  iVar1 = *piVar4;
  __cxa_end_catch();
  return iVar1;
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

#if !KJ_NO_EXCEPTIONS
  try {
#endif
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", *exception));
    }
    context.exit();
#if !KJ_NO_EXCEPTIONS
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
#endif
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}